

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,MemberInfo *parent,uint codeOrder,Reader *decl,StructOrGroup *fieldScope
          ,bool isInUnion)

{
  bool bVar1;
  uint32_t uVar2;
  StringPtr local_1c0;
  Reader local_1b0;
  Reader local_180;
  Reader local_150;
  Reader local_120;
  undefined1 local_f0 [8];
  Reader fieldDecl;
  Fault f;
  undefined1 local_b0 [8];
  DebugComparison<capnp::compiler::Declaration::Which,_capnp::compiler::Declaration::Which>
  _kjCondition;
  Reader local_78;
  ArrayPtr<const_char> local_48;
  undefined1 local_31;
  anon_union_8_2_6a1c0e2c_for_MemberInfo_21 aStack_30;
  bool isInUnion_local;
  StructOrGroup *fieldScope_local;
  Reader *decl_local;
  MemberInfo *pMStack_18;
  uint codeOrder_local;
  MemberInfo *parent_local;
  MemberInfo *this_local;
  
  this->parent = parent;
  this->codeOrder = codeOrder;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = isInUnion;
  local_31 = isInUnion;
  aStack_30 = (anon_union_8_2_6a1c0e2c_for_MemberInfo_21)fieldScope;
  fieldScope_local = (StructOrGroup *)decl;
  decl_local._4_4_ = codeOrder;
  pMStack_18 = parent;
  parent_local = this;
  Declaration::Reader::getName(&local_78,decl);
  local_48 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_78);
  (this->name).content.ptr = local_48.ptr;
  (this->name).content.size_ = local_48.size_;
  Declaration::Reader::getId(&this->declId,(Reader *)fieldScope_local);
  this->declKind = FIELD;
  this->isParam = false;
  this->hasDefaultValue = false;
  Expression::Reader::Reader(&this->fieldType);
  Expression::Reader::Reader(&this->fieldDefaultValue);
  Declaration::Reader::getAnnotations(&this->declAnnotations,(Reader *)fieldScope_local);
  uVar2 = Declaration::Reader::getStartByte((Reader *)fieldScope_local);
  this->startByte = uVar2;
  uVar2 = Declaration::Reader::getEndByte((Reader *)fieldScope_local);
  this->endByte = uVar2;
  kj::Maybe<capnp::Text::Reader>::Maybe();
  kj::Maybe<capnp::schema::Field::Builder>::Maybe(&this->schema);
  capnp::schema::Node::Builder::Builder(&this->node,(void *)0x0);
  capnp::schema::Node::SourceInfo::Builder::Builder(&this->sourceInfo,(void *)0x0);
  this->field_21 = aStack_30;
  f.exception._4_2_ = Declaration::Reader::which((Reader *)fieldScope_local);
  f.exception._6_2_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Which *)((long)&f.exception + 4));
  f.exception._2_2_ = 6;
  kj::_::DebugExpression<capnp::compiler::Declaration::Which>::operator==
            ((DebugComparison<capnp::compiler::Declaration::Which,_capnp::compiler::Declaration::Which>
              *)local_b0,
             (DebugExpression<capnp::compiler::Declaration::Which> *)((long)&f.exception + 6),
             (Which *)((long)&f.exception + 2));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b0);
  if (bVar1) {
    Declaration::Reader::getField((Reader *)local_f0,(Reader *)fieldScope_local);
    Declaration::Field::Reader::getType(&local_120,(Reader *)local_f0);
    (this->fieldType)._reader.dataSize = local_120._reader.dataSize;
    (this->fieldType)._reader.pointerCount = local_120._reader.pointerCount;
    *(undefined2 *)&(this->fieldType)._reader.field_0x26 = local_120._reader._38_2_;
    (this->fieldType)._reader.nestingLimit = local_120._reader.nestingLimit;
    *(undefined4 *)&(this->fieldType)._reader.field_0x2c = local_120._reader._44_4_;
    (this->fieldType)._reader.data = local_120._reader.data;
    (this->fieldType)._reader.pointers = local_120._reader.pointers;
    (this->fieldType)._reader.segment = local_120._reader.segment;
    (this->fieldType)._reader.capTable = local_120._reader.capTable;
    Declaration::Field::Reader::getDefaultValue(&local_150,(Reader *)local_f0);
    bVar1 = Declaration::Field::DefaultValue::Reader::isValue(&local_150);
    if (bVar1) {
      this->hasDefaultValue = true;
      Declaration::Field::Reader::getDefaultValue(&local_1b0,(Reader *)local_f0);
      Declaration::Field::DefaultValue::Reader::getValue(&local_180,&local_1b0);
      memcpy(&this->fieldDefaultValue,&local_180,0x30);
    }
    bVar1 = Declaration::Reader::hasDocComment((Reader *)fieldScope_local);
    if (bVar1) {
      local_1c0.content =
           (ArrayPtr<const_char>)Declaration::Reader::getDocComment((Reader *)fieldScope_local);
      kj::Maybe<capnp::Text::Reader>::operator=(&this->docComment,(Reader *)&local_1c0);
    }
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::compiler::Declaration::Which,capnp::compiler::Declaration::Which>&>
            ((Fault *)&fieldDecl._reader.nestingLimit,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
             ,0x42f,FAILED,"decl.which() == Declaration::FIELD","_kjCondition,",
             (DebugComparison<capnp::compiler::Declaration::Which,_capnp::compiler::Declaration::Which>
              *)local_b0);
  kj::_::Debug::Fault::fatal((Fault *)&fieldDecl._reader.nestingLimit);
}

Assistant:

inline MemberInfo(MemberInfo& parent, uint codeOrder,
                      const Declaration::Reader& decl,
                      StructLayout::StructOrGroup& fieldScope,
                      bool isInUnion)
        : parent(&parent), codeOrder(codeOrder), isInUnion(isInUnion),
          name(decl.getName().getValue()), declId(decl.getId()), declKind(Declaration::FIELD),
          declAnnotations(decl.getAnnotations()),
          startByte(decl.getStartByte()), endByte(decl.getEndByte()),
          node(nullptr), sourceInfo(nullptr), fieldScope(&fieldScope) {
      KJ_REQUIRE(decl.which() == Declaration::FIELD);
      auto fieldDecl = decl.getField();
      fieldType = fieldDecl.getType();
      if (fieldDecl.getDefaultValue().isValue()) {
        hasDefaultValue = true;
        fieldDefaultValue = fieldDecl.getDefaultValue().getValue();
      }
      if (decl.hasDocComment()) {
        docComment = decl.getDocComment();
      }
    }